

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os.c
# Opt level: O0

void sx_os_dlclose(void *handle)

{
  void *handle_local;
  
  if (handle != (void *)0x0) {
    dlclose(handle);
  }
  return;
}

Assistant:

void sx_os_dlclose(void* handle)
{
#if SX_PLATFORM_WINDOWS
    if (handle) 
        FreeLibrary((HMODULE)handle);
#elif SX_PLATFORM_EMSCRIPTEN || SX_PLATFORM_PS4 || SX_PLATFORM_XBOXONE
    sx_unused(handle);
#else
    if (handle)
        dlclose(handle);
#endif
}